

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

String * doctest::detail::stringifyBinaryExpr<char[2],std::__cxx11::string>
                   (char (*lhs) [2],char *op,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  String *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  String *in;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  in = in_RDI;
  toString<char[2],_true>((char (*) [2])in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in);
  doctest::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffff58);
  doctest::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  return in;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }